

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.pb.cc
# Opt level: O2

void proto2_unittest::TestAny::SharedDtor(MessageLite *self)

{
  Any *this;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 3));
    this = (Any *)self[3]._internal_metadata_.ptr_;
    if (this != (Any *)0x0) {
      google::protobuf::Any::~Any(this);
    }
    operator_delete(this,0x28);
    google::protobuf::RepeatedPtrField<google::protobuf::Any>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::Any> *)&self[1]._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/any_test.pb.cc"
             ,0xc6,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestAny::SharedDtor(MessageLite& self) {
  TestAny& this_ = static_cast<TestAny&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.text_.Destroy();
  delete this_._impl_.any_value_;
  this_._impl_.~Impl_();
}